

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

basic_node_ptr<unodb::detail::olc_node_header> __thiscall
unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
leave_last_child(olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                 *this,uint8_t child_to_delete,db_type *db_instance)

{
  bool bVar1;
  basic_node_ptr<unodb::detail::olc_node_header> bVar2;
  
  bVar1 = optimistic_lock::is_obsoleted_by_this_thread((optimistic_lock *)this);
  if (!bVar1) {
    __assert_fail("lock(*this).is_obsoleted_by_this_thread()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x45d,
                  "auto unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  bVar1 = optimistic_lock::is_obsoleted_by_this_thread
                    ((optimistic_lock *)
                     ((this->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).
                      children._M_elems[child_to_delete].value._M_i.tagged_ptr & 0xfffffffffffffff8)
                    );
  if (bVar1) {
    bVar2 = basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            ::leave_last_child(&this->
                                super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                               ,child_to_delete,db_instance);
    return (basic_node_ptr<unodb::detail::olc_node_header>)bVar2.tagged_ptr;
  }
  __assert_fail("node_ptr_lock(this->children[child_to_delete].load()) .is_obsoleted_by_this_thread()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x45f,
                "auto unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

[[nodiscard]] auto leave_last_child(std::uint8_t child_to_delete,
                                      db_type& db_instance) noexcept {
    UNODB_DETAIL_ASSERT(lock(*this).is_obsoleted_by_this_thread());
    UNODB_DETAIL_ASSERT(node_ptr_lock(this->children[child_to_delete].load())
                            .is_obsoleted_by_this_thread());

    return parent_class::leave_last_child(child_to_delete, db_instance);
  }